

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O1

bool vkt::pipeline::isVertexFormatUscaled(VkFormat format)

{
  if (((0x3a < format - VK_FORMAT_A1R5G5B5_UNORM_PACK16) ||
      ((0x410004081020409U >> ((ulong)(format - VK_FORMAT_A1R5G5B5_UNORM_PACK16) & 0x3f) & 1) == 0))
     && ((0x15 < format - VK_FORMAT_R16_USCALED ||
         ((0x204081U >> (format - VK_FORMAT_R16_USCALED & 0x1f) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool isVertexFormatUscaled (VkFormat format)
{
	switch (format)
	{
		case VK_FORMAT_R8_USCALED:
		case VK_FORMAT_R8G8_USCALED:
		case VK_FORMAT_R16_USCALED:
		case VK_FORMAT_A1R5G5B5_UNORM_PACK16:
		case VK_FORMAT_R8G8B8_USCALED:
		case VK_FORMAT_B8G8R8_USCALED:
		case VK_FORMAT_R8G8B8A8_USCALED:
		case VK_FORMAT_A2R10G10B10_USCALED_PACK32:
		case VK_FORMAT_R16G16_USCALED:
		case VK_FORMAT_B8G8R8A8_USCALED:
		case VK_FORMAT_A2B10G10R10_USCALED_PACK32:
		case VK_FORMAT_R16G16B16_USCALED:
		case VK_FORMAT_R16G16B16A16_USCALED:
			return true;

		default:
			break;
	}

	return false;

}